

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void Am_Connection::Delete_Connection(Am_Connection *doomed_connection_ptr)

{
  Am_Connection *this;
  connection_list_class *pcVar1;
  connection_list_class *pcVar2;
  Connection_List_Ptr pcVar3;
  
  pcVar3 = connection_list;
  if (connection_list != (Connection_List_Ptr)0x0) {
    pcVar1 = connection_list;
    pcVar2 = connection_list;
    if (connection_list->connection_ptr == doomed_connection_ptr) {
      connection_list = connection_list->next;
      operator_delete(pcVar3);
      return;
    }
    do {
      pcVar3 = pcVar2;
      pcVar2 = pcVar1;
      if (pcVar2 == (connection_list_class *)0x0) {
        return;
      }
      this = pcVar2->connection_ptr;
      pcVar1 = pcVar2->next;
    } while (this != doomed_connection_ptr);
    pcVar3->next = pcVar2->next;
    if (doomed_connection_ptr != (Am_Connection *)0x0) {
      ~Am_Connection(this);
    }
    operator_delete(this);
    operator_delete(pcVar2);
    num_sockets = num_sockets + -1;
  }
  return;
}

Assistant:

void
Am_Connection::Delete_Connection(Am_Connection *doomed_connection_ptr)
{
  Connection_List_Ptr place_holder, old_place_holder;
  old_place_holder = place_holder = connection_list;
  if (place_holder == nullptr) {
  } else {
    if (place_holder->connection_ptr == doomed_connection_ptr) {
      connection_list = place_holder->next;
      delete (place_holder);
    } else {
      while ((place_holder != nullptr) &&
             (place_holder->connection_ptr != doomed_connection_ptr)) {
        old_place_holder = place_holder;
        place_holder = place_holder->next;
      }
      if (place_holder != nullptr) {
        old_place_holder->next = place_holder->next;
        delete (place_holder->connection_ptr);
        delete (place_holder);
        num_sockets--;
      } else {
      }
    }
  }
}